

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O3

Result * CoreML::validateRecurrentActivationParams
                   (Result *__return_storage_ptr__,ActivationParams *params)

{
  char *__s;
  size_t sVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if (((ulong)params->_oneof_case_[0] < 0x2a) &&
     ((0x300c0000420U >> ((ulong)params->_oneof_case_[0] & 0x3f) & 1) != 0)) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"Recurrent non-linearity type ",0x1d);
    __s = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,__s,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190," is not supported in this version of CoreML.",0x2c);
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRecurrentActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Recurrent non-linearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}